

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  char *pcVar1;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 aVar2;
  int line;
  LogMessageFatal local_20;
  
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
            (&(this->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
            (&(this->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
            (&(this->field_0)._impl_.service_.super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
            (&(this->field_0)._impl_.extension_.super_RepeatedPtrFieldBase);
  RepeatedField<int>::Clear(&(this->field_0)._impl_.public_dependency_);
  RepeatedField<int>::Clear(&(this->field_0)._impl_.weak_dependency_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.option_dependency_.super_RepeatedPtrFieldBase);
  aVar2 = this->field_0;
  if (((undefined1  [232])aVar2 & (undefined1  [232])0x1f) != (undefined1  [232])0x0) {
    if (((undefined1  [232])aVar2 & (undefined1  [232])0x1) != (undefined1  [232])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.name_);
    }
    if (((undefined1  [232])aVar2 & (undefined1  [232])0x2) != (undefined1  [232])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.package_);
    }
    if (((undefined1  [232])aVar2 & (undefined1  [232])0x4) != (undefined1  [232])0x0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.syntax_);
    }
    if (((undefined1  [232])aVar2 & (undefined1  [232])0x8) != (undefined1  [232])0x0) {
      this_00 = (this->field_0)._impl_.options_;
      if (this_00 == (FileOptions *)0x0) {
        pcVar1 = "!value || _impl_.options_ != nullptr";
        line = 0xb39;
        goto LAB_00209b08;
      }
      FileOptions::Clear(this_00);
    }
    if (((undefined1  [232])aVar2 & (undefined1  [232])0x10) != (undefined1  [232])0x0) {
      this_01 = (this->field_0)._impl_.source_code_info_;
      if (this_01 == (SourceCodeInfo *)0x0) {
        pcVar1 = "!value || _impl_.source_code_info_ != nullptr";
        line = 0xb3d;
LAB_00209b08:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,line,pcVar1 + 10);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      SourceCodeInfo::Clear(this_01);
    }
  }
  (this->field_0)._impl_.edition_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FileDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.dependency_.Clear();
  _impl_.message_type_.Clear();
  _impl_.enum_type_.Clear();
  _impl_.service_.Clear();
  _impl_.extension_.Clear();
  _impl_.public_dependency_.Clear();
  _impl_.weak_dependency_.Clear();
  _impl_.option_dependency_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.package_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.syntax_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(_impl_.source_code_info_ != nullptr);
      _impl_.source_code_info_->Clear();
    }
  }
  _impl_.edition_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}